

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readParameters.hpp
# Opt level: O3

array<njoy::ENDFtk::section::Type<5>::Parameter,_2UL> * __thiscall
njoy::ENDFtk::section::Type<5>::WattSpectrum::
readParameters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (array<njoy::ENDFtk::section::Type<5>::Parameter,_2UL> *__return_storage_ptr__,
          WattSpectrum *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  Parameter a;
  Parameter local_158;
  Parameter local_c8;
  
  Parameter::Parameter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&local_158,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
  Parameter::Parameter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&local_c8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
  *(_Head_base<5UL,_long,_false> *)
   &__return_storage_ptr__->_M_elems[0].super_TabulationRecord.super_InterpolationBase.metadata.
    fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long> =
       local_158.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&__return_storage_ptr__->_M_elems[0].super_TabulationRecord.super_InterpolationBase.
          metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl =
       local_158.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&__return_storage_ptr__->_M_elems[0].super_TabulationRecord.super_InterpolationBase.
          metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl =
       local_158.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&__return_storage_ptr__->_M_elems[0].super_TabulationRecord.super_InterpolationBase.
          metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl =
       local_158.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&__return_storage_ptr__->_M_elems[0].super_TabulationRecord.super_InterpolationBase.
          metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl =
       local_158.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  __return_storage_ptr__->_M_elems[0].super_TabulationRecord.super_InterpolationBase.metadata.fields
  .super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       local_158.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  __return_storage_ptr__->_M_elems[0].super_TabulationRecord.super_InterpolationBase.boundaryIndices
  .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       local_158.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&__return_storage_ptr__->_M_elems[0].super_TabulationRecord.super_InterpolationBase.
           boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data + 8) =
       local_158.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&__return_storage_ptr__->_M_elems[0].super_TabulationRecord.super_InterpolationBase.
           boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data + 0x10) =
       local_158.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  __return_storage_ptr__->_M_elems[0].super_TabulationRecord.super_InterpolationBase.
  interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_158.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&__return_storage_ptr__->_M_elems[0].super_TabulationRecord.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data + 8) =
       local_158.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&__return_storage_ptr__->_M_elems[0].super_TabulationRecord.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data + 0x10) =
       local_158.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  __return_storage_ptr__->_M_elems[0].super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       local_158.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_start;
  __return_storage_ptr__->_M_elems[0].super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       local_158.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  __return_storage_ptr__->_M_elems[0].super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_158.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  __return_storage_ptr__->_M_elems[0].super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       local_158.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_start;
  __return_storage_ptr__->_M_elems[0].super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       local_158.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  __return_storage_ptr__->_M_elems[0].super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_158.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  *(_Head_base<5UL,_long,_false> *)
   &__return_storage_ptr__->_M_elems[1].super_TabulationRecord.super_InterpolationBase.metadata.
    fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long> =
       local_c8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&__return_storage_ptr__->_M_elems[1].super_TabulationRecord.super_InterpolationBase.
          metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl =
       local_c8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&__return_storage_ptr__->_M_elems[1].super_TabulationRecord.super_InterpolationBase.
          metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl =
       local_c8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&__return_storage_ptr__->_M_elems[1].super_TabulationRecord.super_InterpolationBase.
          metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl =
       local_c8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&__return_storage_ptr__->_M_elems[1].super_TabulationRecord.super_InterpolationBase.
          metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl =
       local_c8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  __return_storage_ptr__->_M_elems[1].super_TabulationRecord.super_InterpolationBase.metadata.fields
  .super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       local_c8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  __return_storage_ptr__->_M_elems[1].super_TabulationRecord.super_InterpolationBase.boundaryIndices
  .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       local_c8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&__return_storage_ptr__->_M_elems[1].super_TabulationRecord.super_InterpolationBase.
           boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data + 8) =
       local_c8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&__return_storage_ptr__->_M_elems[1].super_TabulationRecord.super_InterpolationBase.
           boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data + 0x10) =
       local_c8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  __return_storage_ptr__->_M_elems[1].super_TabulationRecord.super_InterpolationBase.
  interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_c8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&__return_storage_ptr__->_M_elems[1].super_TabulationRecord.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data + 8) =
       local_c8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&__return_storage_ptr__->_M_elems[1].super_TabulationRecord.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data + 0x10) =
       local_c8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  __return_storage_ptr__->_M_elems[1].super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       local_c8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_start;
  __return_storage_ptr__->_M_elems[1].super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       local_c8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  __return_storage_ptr__->_M_elems[1].super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_c8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  __return_storage_ptr__->_M_elems[1].super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       local_c8.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_start;
  __return_storage_ptr__->_M_elems[1].super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       local_c8.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  __return_storage_ptr__->_M_elems[1].super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_c8.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

static std::array< Parameter, 2 >
readParameters( Iterator& begin,
                const Iterator& end,
                long& lineNumber,
                int MAT,
                int MF,
                int MT ) {

  auto makeParameter = [&] ( auto&& message ) {

    try {

      return Parameter( begin, end, lineNumber, MAT, MF, MT );
    }
    catch ( ... ) {

      Log::info( message );
      throw;
    }
  };

  auto a = makeParameter( "Encountered error while reading the a parameter" );
  auto b = makeParameter( "Encountered error while reading the b parameter" );
  return std::array< Parameter, 2 >{{ std::move( a) , std::move( b ) }};
}